

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Psr_ManWriteVerilogArray(FILE *pFile,Psr_Ntk_t *p,Vec_Int_t *vSigs,int Start,int Stop,int fOdd)

{
  char *pcVar1;
  int iVar2;
  uint local_30;
  int Sig;
  int i;
  int fOdd_local;
  int Stop_local;
  int Start_local;
  Vec_Int_t *vSigs_local;
  Psr_Ntk_t *p_local;
  FILE *pFile_local;
  
  iVar2 = Vec_IntSize(vSigs);
  local_30 = Start;
  if (0 < iVar2) {
    for (; (int)local_30 < Stop; local_30 = local_30 + 1) {
      iVar2 = Vec_IntEntry(vSigs,local_30);
      if ((fOdd == 0) || ((local_30 & 1) != 0)) {
        Psr_ManWriteVerilogSignal(pFile,p,iVar2);
        pcVar1 = "    \"%s\", ";
        if (local_30 == Stop - 1U) {
          pcVar1 = "T = %d\t\t";
        }
        fprintf((FILE *)pFile,"%s",pcVar1 + 8);
      }
    }
    return;
  }
  __assert_fail("Vec_IntSize(vSigs) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacWriteVer.c"
                ,0x46,
                "void Psr_ManWriteVerilogArray(FILE *, Psr_Ntk_t *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Psr_ManWriteVerilogArray( FILE * pFile, Psr_Ntk_t * p, Vec_Int_t * vSigs, int Start, int Stop, int fOdd )
{
    int i, Sig;
    assert( Vec_IntSize(vSigs) > 0 );
    Vec_IntForEachEntryStartStop( vSigs, Sig, i, Start, Stop )
    {
        if ( fOdd && !(i & 1) )
            continue;
        Psr_ManWriteVerilogSignal( pFile, p, Sig );
        fprintf( pFile, "%s", i == Stop - 1 ? "" : ", " );
    }
}